

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_size_invalid_lod
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType dataType;
  DataType dataType_00;
  bool bVar1;
  bool bVar2;
  ContextType CVar3;
  char *pcVar4;
  long *plVar5;
  size_t sVar6;
  ostream *poVar7;
  size_type *psVar8;
  DataType dataType_01;
  DataType dataType_02;
  long lVar9;
  string shaderSource;
  ostringstream source;
  undefined1 auStack_308 [12];
  ShaderType local_2fc;
  string local_2f8;
  long local_2d8;
  string local_2d0;
  string local_2b0;
  string local_290;
  long *local_270;
  long local_268;
  long local_260 [2];
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  long local_1d0;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"textureSize: Invalid lod type.","");
  NegativeTestContext::beginSection(ctx,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  lVar9 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar9];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      local_2fc = shaderType;
      pcVar4 = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,pcVar4,(allocator<char> *)&local_1f0);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x1cc56f3);
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_1a8[0].field_2._0_8_ = *psVar8;
        local_1a8[0].field_2._8_8_ = plVar5[3];
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      }
      else {
        local_1a8[0].field_2._0_8_ = *psVar8;
        local_1a8[0]._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_1a8[0]._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      NegativeTestContext::beginSection(ctx,local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_1d0 = lVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      local_2d8 = 0;
      do {
        CVar3.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar2 = glu::contextSupports(CVar3,(ApiType)0x23);
        bVar1 = true;
        if (!bVar2) {
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_1c8,
                     (_anonymous_namespace_ *)
                     (ulong)(uint)(&NegativeTestShared::(anonymous_namespace)::s_samplerTypes)
                                  [local_2d8],dataType_01);
          bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar1 != false) {
          dataType = (&NegativeTestShared::(anonymous_namespace)::s_samplerTypes)[local_2d8];
          pcVar4 = glu::getDataTypeName(dataType);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f8,pcVar4,(allocator<char> *)&local_1f0);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,0x1cc76ac);
          psVar8 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar8) {
            local_1a8[0].field_2._0_8_ = *psVar8;
            local_1a8[0].field_2._8_8_ = plVar5[3];
            local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          }
          else {
            local_1a8[0].field_2._0_8_ = *psVar8;
            local_1a8[0]._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_1a8[0]._M_string_length = plVar5[1];
          *plVar5 = (long)psVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          NegativeTestContext::beginSection(ctx,local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          lVar9 = 0;
          do {
            dataType_00 = *(DataType *)
                           ((long)&NegativeTestShared::(anonymous_namespace)::s_nonScalarIntTypes +
                           lVar9);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            CVar3.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
            bVar1 = glu::contextSupports(CVar3,(ApiType)0x23);
            pcVar4 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
            if (pcVar4 == (char *)0x0) {
              std::ios::clear((int)auStack_308 +
                              (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 0x160);
            }
            else {
              sVar6 = strlen(pcVar4);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,sVar6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                      (&local_1f0,(_anonymous_namespace_ *)(ulong)dataType,dataType_02);
            getShaderExtensionDeclaration(&local_2f8,&local_1f0);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_2f8._M_dataplus._M_p,
                                local_2f8._M_string_length);
            NegativeTestShared::(anonymous_namespace)::getShaderInitialization_abi_cxx11_
                      (&local_210,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)local_2fc,(ShaderType)psVar8);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_210._M_dataplus._M_p,local_210._M_string_length);
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            local_2b0.field_2._M_allocated_capacity._0_4_ = 0x706d6173;
            local_2b0._M_string_length = 7;
            local_2b0.field_2._M_allocated_capacity._4_4_ = 0x72656c;
            declareShaderUniform(&local_230,dataType,&local_2b0);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_230._M_dataplus._M_p,local_230._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"void main(void)\n",0x10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{\n",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"    ",4);
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
            local_2d0.field_2._M_local_buf[2] = 'd';
            local_2d0.field_2._M_allocated_capacity._0_2_ = 0x6f6c;
            local_2d0._M_string_length = 3;
            local_2d0.field_2._M_local_buf[3] = '\0';
            declareAndInitializeShaderVariable(&local_250,dataType_00,&local_2d0);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_250._M_dataplus._M_p,local_250._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"    textureSize(sampler, lod);\n",0x1f);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,
                              CONCAT44(local_2d0.field_2._M_allocated_capacity._4_4_,
                                       CONCAT13(local_2d0.field_2._M_local_buf[3],
                                                CONCAT12(local_2d0.field_2._M_local_buf[2],
                                                         local_2d0.field_2._M_allocated_capacity.
                                                         _0_2_))) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p,
                              CONCAT44(local_2b0.field_2._M_allocated_capacity._4_4_,
                                       local_2b0.field_2._M_allocated_capacity._0_4_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_290,local_270,local_268 + (long)local_270);
            verifyShader(ctx,local_2fc,&local_290);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_270 != local_260) {
              operator_delete(local_270,local_260[0] + 1);
            }
            lVar9 = lVar9 + 4;
          } while (lVar9 != 0x2c);
          NegativeTestContext::endSection(ctx);
        }
        local_2d8 = local_2d8 + 1;
      } while (local_2d8 != 0x1c);
      NegativeTestContext::endSection(ctx);
      lVar9 = local_1d0;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_size_invalid_lod (NegativeTestContext& ctx)
{
	ctx.beginSection("textureSize: Invalid lod type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_samplerTypes); ++dataTypeNdx)
			{
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(s_samplerTypes[dataTypeNdx])))
				{
					ctx.beginSection("Verify sampler/lod data type" + std::string(getDataTypeName(s_samplerTypes[dataTypeNdx])));
					for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_nonScalarIntTypes); ++dataTypeNdx2)
					{
						if (s_nonScalarIntTypes[dataTypeNdx2] == glu::TYPE_INT)
							continue;

						const std::string shaderSource(genShaderSourceTextureSize_lod(ctx, s_shaders[shaderNdx], s_samplerTypes[dataTypeNdx], s_nonScalarIntTypes[dataTypeNdx2]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					ctx.endSection();
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}